

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_bool j2k_read_mco(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                     opj_event_mgr *p_manager)

{
  opj_image_t *poVar1;
  opj_simple_mcc_decorrelation_data_t *poVar2;
  opj_mct_data_t *poVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  opj_tcp_v2_t *poVar7;
  OPJ_FLOAT32 *pOVar8;
  void *__ptr;
  OPJ_INT32 *pOVar9;
  char *fmt;
  ulong uVar10;
  long lVar11;
  opj_bool oVar12;
  opj_j2k_v2_t *poVar13;
  ulong uVar14;
  OPJ_UINT32 OVar15;
  uint uVar16;
  int iVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  int iVar21;
  undefined1 auVar20 [16];
  OPJ_UINT32 l_nb_stages;
  OPJ_UINT32 l_tmp;
  uint local_54;
  ulong local_50;
  opj_j2k_v2_t *local_48;
  OPJ_UINT32 local_3c;
  opj_image_t *local_38;
  
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar7 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar7 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size == 0) {
    fmt = "Error reading MCO marker\n";
    oVar12 = 0;
    iVar18 = 1;
  }
  else {
    poVar1 = p_j2k->m_private_image;
    oVar12 = 1;
    local_48 = p_j2k;
    opj_read_bytes_LE(p_header_data,&local_54,1);
    poVar13 = local_48;
    auVar6 = _DAT_00219ba0;
    auVar5 = _DAT_00219b90;
    auVar4 = _DAT_00219b80;
    if (local_54 < 2) {
      if (local_54 + 1 == p_header_size) {
        uVar10 = (ulong)poVar1->numcomps;
        if (uVar10 != 0) {
          lVar11 = uVar10 - 1;
          auVar17._8_4_ = (int)lVar11;
          auVar17._0_8_ = lVar11;
          auVar17._12_4_ = (int)((ulong)lVar11 >> 0x20);
          pOVar9 = &poVar7->tccps->m_dc_level_shift;
          uVar14 = 0;
          auVar17 = auVar17 ^ _DAT_00219ba0;
          do {
            auVar19._8_4_ = (int)uVar14;
            auVar19._0_8_ = uVar14;
            auVar19._12_4_ = (int)(uVar14 >> 0x20);
            auVar20 = (auVar19 | auVar5) ^ auVar6;
            iVar18 = auVar17._4_4_;
            if ((bool)(~(auVar20._4_4_ == iVar18 && auVar17._0_4_ < auVar20._0_4_ ||
                        iVar18 < auVar20._4_4_) & 1)) {
              *pOVar9 = 0;
            }
            if ((auVar20._12_4_ != auVar17._12_4_ || auVar20._8_4_ <= auVar17._8_4_) &&
                auVar20._12_4_ <= auVar17._12_4_) {
              pOVar9[0x10e] = 0;
            }
            auVar19 = (auVar19 | auVar4) ^ auVar6;
            iVar21 = auVar19._4_4_;
            if (iVar21 <= iVar18 && (iVar21 != iVar18 || auVar19._0_4_ <= auVar17._0_4_)) {
              pOVar9[0x21c] = 0;
              pOVar9[0x32a] = 0;
            }
            uVar14 = uVar14 + 4;
            pOVar9 = pOVar9 + 0x438;
          } while ((uVar10 + 3 & 0xfffffffffffffffc) != uVar14);
        }
        if (poVar7->m_mct_decoding_matrix != (OPJ_FLOAT32 *)0x0) {
          free(poVar7->m_mct_decoding_matrix);
          poVar7->m_mct_decoding_matrix = (OPJ_FLOAT32 *)0x0;
        }
        if (local_54 != 0) {
          uVar16 = 0;
          do {
            p_header_data = p_header_data + 1;
            opj_read_bytes_LE(p_header_data,&local_3c,1);
            if ((poVar7->m_nb_mcc_records != 0) &&
               (poVar2 = poVar7->m_mcc_records, poVar2->m_index == local_3c)) {
              poVar1 = poVar13->m_private_image;
              OVar15 = poVar2->m_nb_comps;
              if (OVar15 == poVar1->numcomps) {
                poVar3 = poVar2->m_decorrelation_array;
                local_38 = poVar1;
                if (poVar3 != (opj_mct_data_t *)0x0) {
                  local_50 = (ulong)poVar3->m_element_type;
                  OVar15 = OVar15 * OVar15;
                  if (poVar3->m_data_size != MCT_ELEMENT_SIZE[local_50] * OVar15) {
                    return 0;
                  }
                  pOVar8 = (OPJ_FLOAT32 *)malloc((ulong)(OVar15 * 4));
                  poVar7->m_mct_decoding_matrix = pOVar8;
                  if (pOVar8 == (OPJ_FLOAT32 *)0x0) {
                    return 0;
                  }
                  (*j2k_mct_read_functions_to_float[local_50])(poVar3->m_data,pOVar8,OVar15);
                  poVar13 = local_48;
                }
                poVar3 = poVar2->m_offset_array;
                if (poVar3 != (opj_mct_data_t *)0x0) {
                  local_50 = (ulong)poVar3->m_element_type;
                  OVar15 = local_38->numcomps;
                  if (poVar3->m_data_size != MCT_ELEMENT_SIZE[local_50] * OVar15) {
                    return 0;
                  }
                  __ptr = malloc((ulong)(OVar15 * 4));
                  if (__ptr == (void *)0x0) {
                    return 0;
                  }
                  (*j2k_mct_read_functions_to_int32[local_50])(poVar3->m_data,__ptr,OVar15);
                  OVar15 = local_38->numcomps;
                  if (OVar15 != 0) {
                    pOVar9 = &poVar7->tccps->m_dc_level_shift;
                    lVar11 = 0;
                    do {
                      *pOVar9 = *(OPJ_INT32 *)((long)__ptr + lVar11 * 4);
                      pOVar9 = pOVar9 + 0x10e;
                      lVar11 = lVar11 + 1;
                    } while (OVar15 != (OPJ_UINT32)lVar11);
                  }
                  free(__ptr);
                  poVar13 = local_48;
                }
              }
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 < local_54);
        }
        return 1;
      }
      fmt = "Error reading MCO marker\n";
      oVar12 = 0;
    }
    else {
      fmt = "Cannot take in charge multiple transformation stages.\n";
    }
    iVar18 = 2;
  }
  opj_event_msg_v2(p_manager,iVar18,fmt);
  return oVar12;
}

Assistant:

opj_bool j2k_read_mco (	opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager )
{
	OPJ_UINT32 l_tmp, i;
	OPJ_UINT32 l_nb_stages;
	opj_tcp_v2_t * l_tcp;
	opj_tccp_t * l_tccp;
	opj_image_t * l_image;
	opj_image_comp_t * l_img_comp;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_image = p_j2k->m_private_image;
	l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
			&p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
			p_j2k->m_specific_param.m_decoder.m_default_tcp;

	if (p_header_size < 1) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCO marker\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&l_nb_stages,1);				/* Nmco : only one tranform stage*/
	++p_header_data;

	if (l_nb_stages > 1) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Cannot take in charge multiple transformation stages.\n");
		return OPJ_TRUE;
	}

	if (p_header_size != l_nb_stages + 1) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Error reading MCO marker\n");
		return OPJ_FALSE;
	}

	l_tccp = l_tcp->tccps;
	l_img_comp = l_image->comps;

	for (i=0;i<l_image->numcomps;++i) {
		l_tccp->m_dc_level_shift = 0;
		++l_tccp;
	}

	if (l_tcp->m_mct_decoding_matrix) {
		opj_free(l_tcp->m_mct_decoding_matrix);
		l_tcp->m_mct_decoding_matrix = 00;
	}

	for (i=0;i<l_nb_stages;++i) {
		opj_read_bytes(p_header_data,&l_tmp,1);
		++p_header_data;

		if (! j2k_add_mct(l_tcp,p_j2k->m_private_image,l_tmp)) {
			return OPJ_FALSE;
		}
	}

	return OPJ_TRUE;
}